

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

char * __thiscall Exception::what(Exception *this)

{
  char *pcVar1;
  undefined8 *puVar2;
  allocator local_29;
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,this->err_msg,&local_29);
  puVar2 = (undefined8 *)std::__cxx11::string::append(local_28);
  pcVar1 = (char *)*puVar2;
  std::__cxx11::string::~string(local_28);
  return pcVar1;
}

Assistant:

const char* Exception::what() const throw(){
    return string(err_msg).append(err_word).c_str();
}